

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conmon.c
# Opt level: O1

int lws_conmon_append_copy_new_dns_results(lws *wsi,addrinfo *cai)

{
  uint uVar1;
  sockaddr *psVar2;
  addrinfo *paVar3;
  bool bVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  addrinfo *paVar11;
  lws_log_cx *cx;
  char *pcVar12;
  long lVar13;
  undefined8 uVar14;
  
  iVar9 = 0;
  if ((wsi->flags & 0x10000000) != 0) {
    uVar14 = 0;
    do {
      if (cai == (addrinfo *)0x0) {
        return 0;
      }
      paVar11 = (wsi->conmon).dns_results_copy;
      if (paVar11 != (addrinfo *)0x0) {
        do {
          if ((((paVar11->ai_family != cai->ai_family) && (paVar11->ai_addrlen != cai->ai_addrlen))
              && (paVar11->ai_protocol != cai->ai_protocol)) &&
             (((paVar11->ai_family == 2 && (paVar11->ai_socktype != cai->ai_socktype)) &&
              (*(int *)(paVar11->ai_addr->sa_data + 2) == *(int *)(cai->ai_addr->sa_data + 2)))))
          goto LAB_0011830f;
          paVar11 = paVar11->ai_next;
        } while (paVar11 != (addrinfo *)0x0);
      }
      uVar1 = cai->ai_addrlen;
      if (cai->ai_canonname == (char *)0x0) {
        lVar13 = 0;
      }
      else {
        sVar10 = strlen(cai->ai_canonname);
        lVar13 = sVar10 + 1;
      }
      paVar11 = (addrinfo *)
                lws_realloc((void *)0x0,(ulong)uVar1 + 0x30 + lVar13,
                            "lws_conmon_append_copy_new_dns_results");
      if (paVar11 == (addrinfo *)0x0) {
        cx = lwsl_wsi_get_cx(wsi);
        _lws_log_cx(cx,lws_log_prepend_wsi,wsi,2,"lws_conmon_append_copy_new_dns_results","OOM",
                    uVar14);
      }
      else {
        iVar9 = cai->ai_flags;
        iVar6 = cai->ai_family;
        iVar7 = cai->ai_socktype;
        iVar8 = cai->ai_protocol;
        uVar5 = *(undefined4 *)&cai->field_0x14;
        psVar2 = cai->ai_addr;
        pcVar12 = cai->ai_canonname;
        paVar3 = cai->ai_next;
        paVar11->ai_addrlen = cai->ai_addrlen;
        *(undefined4 *)&paVar11->field_0x14 = uVar5;
        paVar11->ai_addr = psVar2;
        paVar11->ai_canonname = pcVar12;
        paVar11->ai_next = paVar3;
        paVar11->ai_flags = iVar9;
        paVar11->ai_family = iVar6;
        paVar11->ai_socktype = iVar7;
        paVar11->ai_protocol = iVar8;
        paVar3 = paVar11 + 1;
        paVar11->ai_addr = (sockaddr *)paVar3;
        memcpy(paVar3,cai->ai_addr,(ulong)cai->ai_addrlen);
        if (lVar13 != 0) {
          pcVar12 = (char *)((long)&paVar3->ai_flags + (ulong)cai->ai_addrlen);
          paVar11->ai_canonname = pcVar12;
          memcpy(pcVar12,cai->ai_canonname,lVar13 + 1);
        }
        paVar11->ai_next = (wsi->conmon).dns_results_copy;
        (wsi->conmon).dns_results_copy = paVar11;
      }
      if (paVar11 == (addrinfo *)0x0) {
        bVar4 = false;
      }
      else {
LAB_0011830f:
        cai = cai->ai_next;
        bVar4 = true;
      }
    } while (bVar4);
    iVar9 = 1;
  }
  return iVar9;
}

Assistant:

int
lws_conmon_append_copy_new_dns_results(struct lws *wsi,
				       const struct addrinfo *cai)
{
	if (!(wsi->flags & LCCSCF_CONMON))
		return 0;

	/*
	 * Let's go through the incoming guys, seeing if we already have them,
	 * or if we want to take a copy
	 */

	while (cai) {
		struct addrinfo *ai = wsi->conmon.dns_results_copy;
		char skip = 0;

		/* do we already have this guy? */

		while (ai) {

			if (ai->ai_family != cai->ai_family &&
			    ai->ai_addrlen != cai->ai_addrlen &&
			    ai->ai_protocol != cai->ai_protocol &&
			    ai->ai_socktype != cai->ai_socktype &&
			    /* either ipv4 or v6 address must match */
			    ((ai->ai_family == AF_INET &&
			      ((struct sockaddr_in *)ai->ai_addr)->
							     sin_addr.s_addr ==
			      ((struct sockaddr_in *)cai->ai_addr)->
							     sin_addr.s_addr)
#if defined(LWS_WITH_IPV6)
					    ||
			    (ai->ai_family == AF_INET6 &&
			     !memcmp(((struct sockaddr_in6 *)ai->ai_addr)->
							     sin6_addr.s6_addr,
				     ((struct sockaddr_in6 *)cai->ai_addr)->
						     sin6_addr.s6_addr, 16))
#endif
			    )) {
				/* yes, we already got a copy then */
				skip = 1;
				break;
			}

			ai = ai->ai_next;
		}

		if (!skip) {
			/*
			 * No we don't already have a copy of this one, let's
			 * allocate and append it then
			 */
			size_t al = sizeof(struct addrinfo) +
				    (size_t)cai->ai_addrlen;
			size_t cl = cai->ai_canonname ?
					strlen(cai->ai_canonname) + 1 : 0;

			ai = lws_malloc(al + cl, __func__);
			if (!ai) {
				lwsl_wsi_warn(wsi, "OOM");
				return 1;
			}
			*ai = *cai;
			ai->ai_addr = (struct sockaddr *)&ai[1];
			memcpy(ai->ai_addr, cai->ai_addr, (size_t)cai->ai_addrlen);

			if (cl) {
				ai->ai_canonname = ((char *)ai->ai_addr) +
							cai->ai_addrlen;
				memcpy(ai->ai_canonname, cai->ai_canonname,
				       cl + 1);
			}
			ai->ai_next = wsi->conmon.dns_results_copy;
			wsi->conmon.dns_results_copy = ai;
		}

		cai = cai->ai_next;
	}

	return 0;
}